

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O2

RK_U32 mpp_buffer_to_addr(MppBuffer buffer,size_t offset)

{
  char *fmt;
  ulong uVar1;
  
  if (buffer == (MppBuffer)0x0) {
    fmt = "NULL buffer convert to zero address\n";
  }
  else if (*(int *)((long)buffer + 0xa0) < 0x400) {
    uVar1 = offset + *(long *)((long)buffer + 0xa8);
    if (uVar1 < 0x400000) {
      return (int)uVar1 * 0x400 + *(int *)((long)buffer + 0xa0);
    }
    fmt = "offset %d + %d is larger than 4M use extra info to send offset\n";
  }
  else {
    fmt = "buffer fd %d is too large\n";
  }
  _mpp_log_l(2,"mpp_buffer",fmt,"mpp_buffer_to_addr");
  return 0;
}

Assistant:

RK_U32 mpp_buffer_to_addr(MppBuffer buffer, size_t offset)
{
    MppBufferImpl *impl = (MppBufferImpl *)buffer;

    if (NULL == impl) {
        mpp_err_f("NULL buffer convert to zero address\n");
        return 0;
    }

    if (impl->info.fd >= (1 << 10)) {
        mpp_err_f("buffer fd %d is too large\n");
        return 0;
    }

    if (impl->offset + offset >= SZ_4M) {
        mpp_err_f("offset %d + %d is larger than 4M use extra info to send offset\n");
        return 0;
    }

    RK_U32 addr = impl->info.fd + ((impl->offset + offset) << 10);

    return addr;
}